

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_geometry.cpp
# Opt level: O2

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"triangle_geometry",&local_31);
  TutorialApplication::TutorialApplication(&this->super_TutorialApplication,&local_30,1,0x200,0x200)
  ;
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TutorialApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__TutorialApplication_002a4d10;
  *(undefined8 *)&(this->super_TutorialApplication).camera.from.field_0 = 0x3fc000003fc00000;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.from.field_0 + 8) = 0xbfc00000;
  *(undefined8 *)&(this->super_TutorialApplication).camera.to.field_0 = 0;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.to.field_0 + 8) = 0;
  return;
}

Assistant:

Tutorial()
      : TutorialApplication(NAME,FEATURES)
    {
      /* set default camera */
      camera.from = Vec3fa(1.5f,1.5f,-1.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }